

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

bool sb_switch_reserved_blocks(filemgr *file)

{
  void *pvVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  docio_length *pdVar5;
  __pointer_type puVar6;
  uint64_t uVar7;
  superblock *in_RDI;
  size_t in_stack_00000010;
  uint8_t *old_prev_bmp;
  filemgr *in_stack_00000020;
  sb_rsv_bmp *rsv;
  superblock *sb;
  size_t i;
  uint32_t in_stack_ffffffffffffffa8;
  memory_order in_stack_ffffffffffffffac;
  superblock *in_stack_ffffffffffffffb0;
  err_log_callback *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 sync_option;
  void *__ptr;
  filemgr *in_stack_ffffffffffffffc8;
  ulong local_18;
  bool local_1;
  
  pvVar1 = (void *)in_RDI[2].revnum.super___atomic_base<unsigned_long>._M_i;
  lVar2 = *(long *)((long)pvVar1 + 0x88);
  if (lVar2 == 0) {
    local_1 = false;
  }
  else {
    bVar4 = atomic_cas_uint32_t((atomic<unsigned_int> *)in_stack_ffffffffffffffb0,
                                in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    sync_option = (undefined1)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
    if (bVar4) {
      if (*(long *)((long)pvVar1 + 0x60) != 0) {
        for (local_18 = 0; sync_option = (undefined1)((ulong)in_stack_ffffffffffffffc0 >> 0x38),
            local_18 < *(ulong *)((long)pvVar1 + 0x70); local_18 = local_18 + 1) {
          in_stack_ffffffffffffffb8 =
               *(err_log_callback **)(*(long *)((long)pvVar1 + 0x60) + local_18 * 8);
          pdVar5 = (docio_length *)(*(long *)((long)pvVar1 + 0x68) + local_18 * 0x38);
          in_stack_ffffffffffffffc8 = *(filemgr **)pdVar5;
          in_stack_ffffffffffffffb0 = in_RDI;
          _fdb_get_docsize(*pdVar5);
          filemgr_mark_stale(in_stack_00000020,(bid_t)old_prev_bmp,in_stack_00000010);
        }
        free(*(void **)((long)pvVar1 + 0x60));
        free(*(void **)((long)pvVar1 + 0x68));
        *(undefined8 *)((long)pvVar1 + 0x60) = 0;
        *(undefined8 *)((long)pvVar1 + 0x68) = 0;
      }
      filemgr_sync(in_stack_ffffffffffffffc8,(bool)sync_option,in_stack_ffffffffffffffb8);
      _free_bmp_idx((avl_tree *)in_stack_ffffffffffffffb0);
      sb_bmp_change_begin(in_stack_ffffffffffffffb0);
      __ptr = (void *)0x0;
      if (*(long *)((long)pvVar1 + 0x48) != 0) {
        __ptr = *(void **)((long)pvVar1 + 0x48);
      }
      puVar6 = std::atomic::operator_cast_to_unsigned_char_((atomic<unsigned_char_*> *)0x16c740);
      *(__pointer_type *)((long)pvVar1 + 0x48) = puVar6;
      uVar7 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_ffffffffffffffb0,
                                  in_stack_ffffffffffffffac);
      *(uint64_t *)((long)pvVar1 + 0x40) = uVar7;
      std::atomic_store<unsigned_long>
                ((atomic<unsigned_long> *)in_stack_ffffffffffffffb0,
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      atomic_store_uint64_t
                ((atomic<unsigned_long> *)in_stack_ffffffffffffffb0,
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),memory_order_relaxed)
      ;
      std::atomic<unsigned_char_*>::operator=
                ((atomic<unsigned_char_*> *)in_stack_ffffffffffffffb0,
                 (__pointer_type)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      *(undefined8 *)((long)pvVar1 + 0x50) = *(undefined8 *)(lVar2 + 0x18);
      *(undefined8 *)((long)pvVar1 + 0x58) = *(undefined8 *)(lVar2 + 0x20);
      *(undefined8 *)((long)pvVar1 + 0x60) = *(undefined8 *)(lVar2 + 0x28);
      *(undefined8 *)((long)pvVar1 + 0x68) = *(undefined8 *)(lVar2 + 0x30);
      *(undefined8 *)((long)pvVar1 + 0x70) = *(undefined8 *)(lVar2 + 0x38);
      uVar3 = *(undefined8 *)(lVar2 + 0x40);
      *(undefined8 *)((long)pvVar1 + 0x78) = uVar3;
      *(undefined8 *)((long)pvVar1 + 0x80) = uVar3;
      atomic_store_uint64_t
                ((atomic<unsigned_long> *)in_stack_ffffffffffffffb0,
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),memory_order_relaxed)
      ;
      *(undefined8 *)((long)pvVar1 + 0xa0) = *(undefined8 *)(lVar2 + 0x50);
      *(undefined8 *)((long)pvVar1 + 0xa8) = *(undefined8 *)(lVar2 + 0x58);
      sb_bmp_change_end((superblock *)0x16c875);
      free(__ptr);
      free(*(void **)((long)pvVar1 + 0x88));
      *(undefined8 *)((long)pvVar1 + 0x88) = 0;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool sb_switch_reserved_blocks(struct filemgr *file)
{
    size_t i;
    struct superblock *sb = file->sb;
    struct sb_rsv_bmp *rsv = sb->rsv_bmp;

    // reserved block should exist
    if (!rsv) {
        return false;
    }
    // should be in a normal status
    if (!atomic_cas_uint32_t(&rsv->status, SB_RSV_READY, SB_RSV_VOID)) {
        return false;
    }
    // now status becomes 'VOID' so that rsv_bmp is not available.

    // mark stale previous system docs
    if (sb->bmp_doc_offset) {
        for (i=0; i<sb->num_bmp_docs; ++i) {
            filemgr_mark_stale(file, sb->bmp_doc_offset[i],
                _fdb_get_docsize(sb->bmp_docs[i].length));
        }

        free(sb->bmp_doc_offset);
        free(sb->bmp_docs);
        sb->bmp_doc_offset = NULL;
        sb->bmp_docs = NULL;
    }

    // should flush all dirty blocks in cache
    filemgr_sync(file, false, NULL);

    // free current bitmap idx
    _free_bmp_idx(&sb->bmp_idx);

    // temporarily keep current bitmap
    sb_bmp_change_begin(sb);
    uint8_t *old_prev_bmp = NULL;
    if (sb->bmp_prev) {
        old_prev_bmp = sb->bmp_prev;
    }
    sb->bmp_prev = sb->bmp;
    sb->bmp_prev_size = atomic_get_uint64_t(&sb->bmp_size);

    // copy all pointers from rsv to sb
    atomic_store(&sb->bmp_revnum, rsv->bmp_revnum);
    atomic_store_uint64_t(&sb->bmp_size, rsv->bmp_size);
    sb->bmp = rsv->bmp;
    sb->bmp_idx = rsv->bmp_idx;
    sb->bmp_doc_offset = rsv->bmp_doc_offset;
    sb->bmp_docs = rsv->bmp_docs;
    sb->num_bmp_docs = rsv->num_bmp_docs;
    sb->num_free_blocks = sb->num_init_free_blocks = rsv->num_free_blocks;
    atomic_store_uint64_t(&sb->cur_alloc_bid, rsv->cur_alloc_bid);
    sb->min_live_hdr_revnum = rsv->min_live_hdr_revnum;
    sb->min_live_hdr_bid = rsv->min_live_hdr_bid;
    sb_bmp_change_end(sb);

    free(old_prev_bmp);
    free(sb->rsv_bmp);
    sb->rsv_bmp = NULL;

    return true;
}